

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLElement * __thiscall tinyxml2::XMLNode::ToElementWithName(XMLNode *this,char *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *p;
  XMLElement *this_00;
  
  iVar2 = (*this->_vptr_XMLNode[6])();
  this_00 = (XMLElement *)CONCAT44(extraout_var,iVar2);
  if (this_00 == (XMLElement *)0x0) {
    this_00 = (XMLElement *)0x0;
  }
  else if (name != (char *)0x0) {
    p = Value((XMLNode *)this_00);
    bVar1 = XMLUtil::StringEqual(p,name,0x7fffffff);
    if (!bVar1) {
      this_00 = (XMLElement *)0x0;
    }
  }
  return this_00;
}

Assistant:

const XMLElement* XMLNode::ToElementWithName( const char* name ) const
{
    const XMLElement* element = this->ToElement();
    if ( element == 0 ) {
        return 0;
    }
    if ( name == 0 ) {
        return element;
    }
    if ( XMLUtil::StringEqual( element->Name(), name ) ) {
       return element;
    }
    return 0;
}